

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool el::base::utils::File::pathExists(char *path,bool considerFile)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat st;
  bool considerFile_local;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._7_1_ = false;
  }
  else {
    st.__glibc_reserved[2]._7_1_ = considerFile;
    iVar1 = stat(path,(stat *)local_b0);
    path_local._7_1_ = iVar1 == 0;
  }
  return path_local._7_1_;
}

Assistant:

static inline bool pathExists(const char* path, bool considerFile = false) {
        if (path == nullptr) {
            return false;
        }
#if ELPP_OS_UNIX
        ELPP_UNUSED(considerFile);
        struct stat st;
        return (stat(path, &st) == 0);
#elif ELPP_OS_WINDOWS
        DWORD fileType = GetFileAttributesA(path);
        if (fileType == INVALID_FILE_ATTRIBUTES) {
            return false;
        }
        return considerFile ? true : ((fileType & FILE_ATTRIBUTE_DIRECTORY) == 0 ? false : true);
#endif  // ELPP_OS_UNIX
    }